

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::~CNullDriver(CNullDriver *this,void **vtt)

{
  u32 uVar1;
  CNullDriver *in_RSI;
  IVideoDriver *in_RDI;
  u32 i;
  CNullDriver *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint uVar3;
  uint local_14;
  
  in_RDI->_vptr_IVideoDriver = (in_RSI->super_IVideoDriver)._vptr_IVideoDriver;
  *(undefined8 *)((long)&in_RDI->_vptr_IVideoDriver + (long)in_RDI->_vptr_IVideoDriver[-3]) =
       *(undefined8 *)&(in_RSI->super_IVideoDriver).field_0x18;
  *(undefined8 *)&in_RDI->field_0x8 = 0x43ae50;
  if (in_RDI[0xf]._vptr_IVideoDriver != (_func_int **)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RDI[9]._vptr_IVideoDriver != (_func_int **)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (*(long *)&in_RDI[9].field_0x8 != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  (*in_RDI->_vptr_IVideoDriver[0x24])();
  deleteAllTextures(in_stack_00000090);
  local_14 = 0;
  while( true ) {
    uVar3 = local_14;
    uVar1 = core::array<irr::video::IImageLoader_*>::size
                      ((array<irr::video::IImageLoader_*> *)0x308ec2);
    if (uVar1 <= uVar3) break;
    core::array<irr::video::IImageLoader_*>::operator[]
              ((array<irr::video::IImageLoader_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    uVar2 = local_14;
    uVar1 = core::array<irr::video::IImageWriter_*>::size
                      ((array<irr::video::IImageWriter_*> *)0x308f1e);
    if (uVar1 <= uVar2) break;
    core::array<irr::video::IImageWriter_*>::operator[]
              ((array<irr::video::IImageWriter_*> *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffcc)
    ;
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_14 = local_14 + 1;
  }
  deleteMaterialRenders(in_RSI);
  (*in_RDI->_vptr_IVideoDriver[0x19])();
  SMaterial::~SMaterial((SMaterial *)in_RSI);
  SMaterial::~SMaterial((SMaterial *)in_RSI);
  SOverrideMaterial::~SOverrideMaterial((SOverrideMaterial *)CONCAT44(uVar3,uVar2));
  std::__cxx11::
  list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ::~list((list<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
           *)0x308fae);
  core::array<irr::video::CNullDriver::SMaterialRenderer>::~array
            ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x308fbf);
  core::array<irr::video::IImageWriter_*>::~array((array<irr::video::IImageWriter_*> *)0x308fd0);
  core::array<irr::video::IImageLoader_*>::~array((array<irr::video::IImageLoader_*> *)0x308fe1);
  core::array<irr::video::ITexture_*>::~array((array<irr::video::ITexture_*> *)0x308fef);
  core::array<irr::video::IRenderTarget_*>::~array((array<irr::video::IRenderTarget_*> *)0x308ffd);
  core::array<irr::video::CNullDriver::SOccQuery>::~array
            ((array<irr::video::CNullDriver::SOccQuery> *)0x30900b);
  core::array<irr::video::CNullDriver::SSurface>::~array
            ((array<irr::video::CNullDriver::SSurface> *)0x309019);
  IGPUProgrammingServices::~IGPUProgrammingServices((IGPUProgrammingServices *)&in_RDI->field_0x8);
  IVideoDriver::~IVideoDriver(in_RDI,(void **)&(in_RSI->super_IVideoDriver).field_0x8);
  return;
}

Assistant:

CNullDriver::~CNullDriver()
{
	if (DriverAttributes)
		DriverAttributes->drop();

	if (FileSystem)
		FileSystem->drop();

	if (MeshManipulator)
		MeshManipulator->drop();

	removeAllRenderTargets();

	deleteAllTextures();

	u32 i;
	for (i = 0; i < SurfaceLoader.size(); ++i)
		SurfaceLoader[i]->drop();

	for (i = 0; i < SurfaceWriter.size(); ++i)
		SurfaceWriter[i]->drop();

	// delete material renderers
	deleteMaterialRenders();

	// delete hardware mesh buffers
	removeAllHardwareBuffers();
}